

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&> * __thiscall
Catch::ExprLhs<trng::poisson_dist_const&>::operator==
          (BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&>
           *__return_storage_ptr__,ExprLhs<trng::poisson_dist_const&> *this,poisson_dist *rhs)

{
  double dVar1;
  double dVar2;
  poisson_dist *ppVar3;
  StringRef local_38;
  
  ppVar3 = *(poisson_dist **)this;
  dVar1 = (ppVar3->P).mu_;
  dVar2 = (rhs->P).mu_;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = dVar1 == dVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002ea538;
  __return_storage_ptr__->m_lhs = ppVar3;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }